

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

SHADING_RATE Diligent::VkFragmentSizeToShadingRate(VkExtent2D *Size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  string msg;
  string local_48;
  
  uVar1 = Size->width - 1;
  if (((Size->width ^ uVar1) <= uVar1) ||
     (uVar1 = Size->height - 1, (Size->height ^ uVar1) <= uVar1)) {
    FormatString<char[26],char[54]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height)",
               (char (*) [54])(ulong)uVar1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = Size->width;
  uVar3 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  if (uVar1 == 0) {
    uVar3 = 0x20;
  }
  uVar2 = Size->height;
  uVar4 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  if (uVar2 == 0) {
    uVar4 = 0x20;
  }
  if (1 << ((byte)uVar3 & 0x1f) != uVar1) {
    FormatString<char[26],char[24]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << X) == Size.width",(char (*) [24])(ulong)uVar3);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (1 << ((SHADING_RATE)uVar4 & 0x1f) != Size->height) {
    FormatString<char[26],char[25]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(1u << Y) == Size.height",(char (*) [25])(ulong)uVar4);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"VkFragmentSizeToShadingRate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x77f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return (SHADING_RATE)(uVar3 << 2) | (SHADING_RATE)uVar4;
}

Assistant:

SHADING_RATE VkFragmentSizeToShadingRate(const VkExtent2D& Size)
{
    VERIFY_EXPR(IsPowerOfTwo(Size.width) && IsPowerOfTwo(Size.height));
    uint32_t X = PlatformMisc::GetMSB(Size.width);
    uint32_t Y = PlatformMisc::GetMSB(Size.height);
    VERIFY_EXPR((1u << X) == Size.width);
    VERIFY_EXPR((1u << Y) == Size.height);
    return static_cast<SHADING_RATE>((X << SHADING_RATE_X_SHIFT) | Y);
}